

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_install_snapshot_resp(raft_server *this,resp_msg *resp)

{
  uint uVar1;
  element_type *peVar2;
  peer *pp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __int_type _Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ulong uVar6;
  type tVar7;
  int iVar8;
  int iVar9;
  iterator iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  ptr<snapshot_sync_ctx> sync_ctx;
  string local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  snapshot_sync_ctx *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  peer *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 4 < iVar8)) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar11 = "not accepted";
    if (resp->accepted_ != false) {
      pcVar11 = "accepted";
    }
    msg_if_given_abi_cxx11_(&local_78,"%s\n",pcVar11);
    (*peVar2->_vptr_logger[8])
              (peVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x148,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p));
    }
  }
  local_78._M_dataplus._M_p._0_4_ = (resp->super_msg_base).src_;
  iVar10 = std::
           _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_78);
  if (iVar10.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
      _M_cur == (__node_type *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      return;
    }
    iVar8 = (*peVar2->_vptr_logger[7])();
    if (iVar8 < 4) {
      return;
    }
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_78,"the response is from an unknown peer %d",
               (ulong)(uint)(resp->super_msg_base).src_);
    (*peVar2->_vptr_logger[8])
              (peVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp",0x14b,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) ==
        &local_78.field_2) {
      return;
    }
    operator_delete((undefined1 *)
                    CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p));
    return;
  }
  pp = *(peer **)((long)iVar10.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)iVar10.
                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                    ._M_cur + 0x18);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (resp->accepted_ != true) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 2 < iVar8)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = ((pp->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->id_;
      _Var4 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
      iVar8 = (*((this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_log_store[2])();
      msg_if_given_abi_cxx11_
                (&local_78,
                 "peer %d declined snapshot: p->get_next_log_idx(): %lu, log_store_->next_slot(): %lu"
                 ,(ulong)uVar1,_Var4,CONCAT44(extraout_var,iVar8));
      (*peVar2->_vptr_logger[8])
                (peVar2,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x17d,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p));
      }
    }
    LOCK();
    (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i = resp->next_idx_;
    UNLOCK();
    uVar6 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
    iVar8 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    iVar9 = pthread_mutex_lock((pthread_mutex_t *)&pp->lock_);
    if (iVar9 != 0) {
      std::__throw_system_error(iVar9);
    }
    bVar12 = uVar6 < CONCAT44(extraout_var_00,iVar8);
    clear_snapshot_sync_ctx(this,pp);
    goto LAB_0014250e;
  }
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&pp->lock_);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  peer::get_snapshot_sync_ctx((peer *)&stack0xffffffffffffffb0);
  if (local_50 == (snapshot_sync_ctx *)0x0) {
    peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 3 < iVar8)) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_78,"no snapshot sync context for this peer, drop the response")
      ;
      (*peVar2->_vptr_logger[8])
                (peVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                 ,"handle_install_snapshot_resp",0x157,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p));
      }
    }
    bVar12 = false;
  }
  else {
    peVar3 = (local_50->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_58 = (local_50->snapshot_).
               super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_58->_M_use_count = local_58->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_58->_M_use_count = local_58->_M_use_count + 1;
      }
    }
    tVar7 = peVar3->type_;
    if (tVar7 == raw_binary) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar8 = (*peVar2->_vptr_logger[7])();
        if (4 < iVar8) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_78,"resp.get_next_idx(): %lu, snp->size(): %lu",resp->next_idx_,
                     peVar3->size_);
          (*peVar2->_vptr_logger[8])
                    (peVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"handle_install_snapshot_resp",0x15f,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                     (int32)local_78._M_dataplus._M_p));
          }
        }
        tVar7 = peVar3->type_;
        if (tVar7 != raw_binary) goto LAB_001422d2;
      }
      if (resp->next_idx_ < peVar3->size_) goto LAB_00142466;
LAB_0014230a:
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 4 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_78,"snapshot sync is done (raw type)");
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x16a,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p)
                         );
        }
      }
      LOCK();
      (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i =
           ((local_50->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->last_log_idx_ + 1;
      UNLOCK();
      pp->matched_idx_ =
           ((local_50->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->last_log_idx_;
      clear_snapshot_sync_ctx(this,pp);
      bVar12 = true;
      LOCK();
      bVar13 = (pp->pending_commit_flag_)._M_base._M_i == true;
      if (bVar13) {
        (pp->pending_commit_flag_)._M_base._M_i = false;
      }
      UNLOCK();
      if (!bVar13) {
        uVar6 = (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
        iVar8 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        bVar12 = uVar6 < CONCAT44(extraout_var_01,iVar8);
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 3 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_78,"snapshot done %lu, %lu, %d",
                   (pp->next_log_idx_).super___atomic_base<unsigned_long>._M_i,pp->matched_idx_,
                   (ulong)bVar12);
        (*peVar2->_vptr_logger[8])
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x172,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p)
                         );
        }
      }
    }
    else {
LAB_001422d2:
      if (tVar7 == logical_object) {
        peVar5 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_01 = (resp->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if (peVar5 != (element_type *)0x0) goto LAB_0014230a;
      }
LAB_00142466:
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar2 != (element_type *)0x0) && (iVar8 = (*peVar2->_vptr_logger[7])(), 4 < iVar8)) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_78,"continue to sync snapshot at offset %lu",resp->next_idx_)
        ;
        (*peVar2->_vptr_logger[8])
                  (peVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp",0x175,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(int32)local_78._M_dataplus._M_p)
                         );
        }
      }
      bVar12 = true;
      snapshot_sync_ctx::set_offset(local_50,resp->next_idx_);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
LAB_0014250e:
  pthread_mutex_unlock((pthread_mutex_t *)&pp->lock_);
  if ((bVar12 != false) && ((this->role_)._M_i == leader)) {
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_40 = pp;
    local_38._M_pi = this_00;
    request_append_entries(this,(ptr<peer> *)&stack0xffffffffffffffc0);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp(resp_msg& resp) {
    p_db("%s\n", resp.get_accepted() ? "accepted" : "not accepted");
    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }

    // if there are pending logs to be synced or commit index need to be advanced,
    // continue to send appendEntries to this peer
    bool need_to_catchup = true;
    ptr<peer> p = it->second;
    if (resp.get_accepted()) {
        std::lock_guard<std::mutex> guard(p->get_lock());
        ptr<snapshot_sync_ctx> sync_ctx = p->get_snapshot_sync_ctx();
        if (sync_ctx == nullptr) {
            p_in("no snapshot sync context for this peer, drop the response");
            need_to_catchup = false;

        } else {
            ptr<snapshot> snp = sync_ctx->get_snapshot();
            if (snp->get_type() == snapshot::raw_binary) {
                // LCOV_EXCL_START
                p_db("resp.get_next_idx(): %" PRIu64 ", snp->size(): %" PRIu64,
                     resp.get_next_idx(), snp->size());
                // LCOV_EXCL_STOP
            }

            bool snp_install_done =
                 ( snp->get_type() == snapshot::raw_binary &&
                   resp.get_next_idx() >= snp->size() )           ||
                 ( snp->get_type() == snapshot::logical_object &&
                   resp.get_ctx() );

            if (snp_install_done) {
                p_db("snapshot sync is done (raw type)");
                p->set_next_log_idx(sync_ctx->get_snapshot()->get_last_log_idx() + 1);
                p->set_matched_idx(sync_ctx->get_snapshot()->get_last_log_idx());
                clear_snapshot_sync_ctx(*p);

                need_to_catchup = p->clear_pending_commit() ||
                                  p->get_next_log_idx() < log_store_->next_slot();
                p_in("snapshot done %" PRIu64 ", %" PRIu64 ", %d",
                     p->get_next_log_idx(), p->get_matched_idx(), need_to_catchup);
            } else {
                p_db("continue to sync snapshot at offset %" PRIu64,
                     resp.get_next_idx());
                sync_ctx->set_offset(resp.get_next_idx());
            }
        }

    } else {
        p_wn( "peer %d declined snapshot: p->get_next_log_idx(): %" PRIu64 ", "
              "log_store_->next_slot(): %" PRIu64,
              p->get_id(), p->get_next_log_idx(), log_store_->next_slot() );
        p->set_next_log_idx(resp.get_next_idx());

        // Added by Jung-Sang Ahn (Oct 11 2017)
        // Declining snapshot implies that the peer already has the up-to-date snapshot.
        need_to_catchup = p->get_next_log_idx() < log_store_->next_slot();

        // Should reset current snapshot context,
        // to continue with more recent snapshot.
        std::lock_guard<std::mutex> guard(p->get_lock());
        clear_snapshot_sync_ctx(*p);
    }

    // This may not be a leader anymore, such as
    // the response was sent out long time ago
    // and the role was updated by UpdateTerm call
    // Try to match up the logs for this peer
    if (role_ == srv_role::leader && need_to_catchup) {
        request_append_entries(p);
    }
}